

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O2

void __thiscall amrex::Cluster::minBox(Cluster *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  IntVect *pIVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  if (this->m_len != 0) {
    pIVar4 = this->m_ar;
    iVar6 = pIVar4->vect[0];
    iVar8 = pIVar4->vect[1];
    iVar5 = pIVar4->vect[2];
    piVar9 = pIVar4[1].vect + 2;
    iVar11 = iVar8;
    iVar12 = iVar6;
    iVar7 = iVar5;
    for (lVar10 = 1; lVar10 < this->m_len; lVar10 = lVar10 + 1) {
      iVar1 = ((IntVect *)(piVar9 + -2))->vect[0];
      if (iVar1 <= iVar6) {
        iVar6 = iVar1;
      }
      iVar2 = piVar9[-1];
      if (iVar2 <= iVar8) {
        iVar8 = iVar2;
      }
      iVar3 = *piVar9;
      if (iVar3 <= iVar7) {
        iVar7 = iVar3;
      }
      if (iVar12 <= iVar1) {
        iVar12 = iVar1;
      }
      if (iVar11 <= iVar2) {
        iVar11 = iVar2;
      }
      if (iVar5 <= iVar3) {
        iVar5 = iVar3;
      }
      piVar9 = piVar9 + 3;
    }
    (this->m_bx).smallend.vect[0] = iVar6;
    (this->m_bx).smallend.vect[1] = iVar8;
    (this->m_bx).smallend.vect[2] = iVar7;
    (this->m_bx).bigend.vect[0] = iVar12;
    (this->m_bx).bigend.vect[1] = iVar11;
    (this->m_bx).bigend.vect[2] = iVar5;
    (this->m_bx).btype.itype = 0;
    return;
  }
  (this->m_bx).smallend.vect[0] = 1;
  (this->m_bx).smallend.vect[1] = 1;
  (this->m_bx).smallend.vect[2] = 1;
  (this->m_bx).bigend.vect[0] = 0;
  (this->m_bx).bigend.vect[1] = 0;
  *(undefined8 *)((this->m_bx).bigend.vect + 2) = 0;
  return;
}

Assistant:

void
Cluster::minBox () noexcept
{
    if (m_len == 0)
    {
        m_bx = Box();
    }
    else
    {
        IntVect lo = m_ar[0], hi = lo;
        for (int i = 1; i < m_len; i++)
        {
            lo.min(m_ar[i]);
            hi.max(m_ar[i]);
        }
        m_bx = Box(lo,hi);
    }
}